

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_trap_message(wasm_trap_t *trap,wasm_message_t *out)

{
  Trap *this;
  string local_48;
  wasm_message_t local_28;
  wasm_message_t *local_18;
  wasm_message_t *out_local;
  wasm_trap_t *trap_local;
  
  local_18 = out;
  out_local = (wasm_message_t *)trap;
  if (trap != (wasm_trap_t *)0x0) {
    this = wasm_ref_t::As<wabt::interp::Trap>(&trap->super_wasm_ref_t);
    wabt::interp::Trap::message_abi_cxx11_(&local_48,this);
    local_28 = FromString(&local_48);
    local_18->size = local_28.size;
    local_18->data = local_28.data;
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  __assert_fail("trap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x246,"void wasm_trap_message(const wasm_trap_t *, wasm_message_t *)");
}

Assistant:

void wasm_trap_message(const wasm_trap_t* trap, own wasm_message_t* out) {
  assert(trap);
  *out = FromString(trap->As<Trap>()->message());
}